

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaDedicatedAllocationList::BuildStatsString(VmaDedicatedAllocationList *this,VmaJsonWriter *json)

{
  VmaAllocation_T *this_00;
  DedicatedAllocationLinkedList *pDVar1;
  VmaMutexLockRead lock;
  
  lock.m_pMutex = (VmaRWMutex *)0x0;
  if (this->m_UseMutex != false) {
    lock.m_pMutex = &this->m_Mutex;
  }
  if (this->m_UseMutex == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&this->m_Mutex);
  }
  VmaJsonWriter::BeginArray(json,false);
  pDVar1 = &this->m_AllocationList;
  while (this_00 = pDVar1->m_Front, this_00 != (VmaAllocation_T *)0x0) {
    VmaJsonWriter::BeginObject(json,true);
    VmaAllocation_T::PrintParameters(this_00,json);
    VmaJsonWriter::EndObject(json);
    pDVar1 = (DedicatedAllocationLinkedList *)((long)&this_00->field_0 + 0x20);
  }
  VmaJsonWriter::EndArray(json);
  VmaMutexLockRead::~VmaMutexLockRead(&lock);
  return;
}

Assistant:

void VmaDedicatedAllocationList::BuildStatsString(VmaJsonWriter& json)
{
    VmaMutexLockRead lock(m_Mutex, m_UseMutex);
    json.BeginArray();
    for (VmaAllocation alloc = m_AllocationList.Front();
        alloc != VMA_NULL; alloc = m_AllocationList.GetNext(alloc))
    {
        json.BeginObject(true);
        alloc->PrintParameters(json);
        json.EndObject();
    }
    json.EndArray();
}